

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

Joint * __thiscall
CMU462::DynamicScene::Skeleton::createNewJoint(Skeleton *this,Joint *parent,Vector3D *endPos)

{
  Joint *this_00;
  undefined1 local_1e0 [48];
  Vector3D VStack_1b0;
  double local_198;
  double meshScale;
  Vector3D local_170;
  undefined1 local_158 [8];
  Matrix4x4 invT;
  Matrix4x4 T;
  Vector4D endPos4d;
  Joint *local_28;
  Joint *newJoint;
  Vector3D *endPos_local;
  Joint *parent_local;
  Skeleton *this_local;
  
  newJoint = (Joint *)endPos;
  endPos_local = (Vector3D *)parent;
  parent_local = (Joint *)this;
  this_00 = (Joint *)operator_new(0x160);
  Joint::Joint(this_00,this);
  this_00->parent = (Joint *)endPos_local;
  local_28 = this_00;
  Vector4D::Vector4D((Vector4D *)&T.entries[3].w,endPos,1.0);
  (*(local_28->super_SceneObject)._vptr_SceneObject[0xb])(&invT.entries[3].w);
  Matrix4x4::inv((Matrix4x4 *)local_158,(Matrix4x4 *)&invT.entries[3].w);
  Matrix4x4::operator*((Vector4D *)&meshScale,(Matrix4x4 *)local_158,(Vector4D *)&T.entries[3].w);
  Vector4D::projectTo3D(&local_170,(Vector4D *)&meshScale);
  endPos->x = local_170.x;
  endPos->y = local_170.y;
  endPos->z = local_170.z;
  (local_28->axis).x = endPos->x;
  (local_28->axis).y = endPos->y;
  (local_28->axis).z = endPos->z;
  (*(this->mesh->super_SceneObject)._vptr_SceneObject[4])(local_1e0);
  local_198 = Vector3D::norm(&VStack_1b0);
  local_28->renderScale = local_198;
  local_28->capsuleRadius = local_198 * local_28->capsuleRadius;
  if (endPos_local != (Vector3D *)0x0) {
    std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::
    push_back((vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
               *)(endPos_local + 10),&local_28);
  }
  std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::
  push_back(&this->joints,&local_28);
  return local_28;
}

Assistant:

Joint* Skeleton::createNewJoint(Joint * parent, Vector3D endPos)
   {
     Joint* newJoint = new Joint(this);
     newJoint->parent = parent;
      // Get the endPos in joint's local coordinate frame
      Vector4D endPos4d(endPos, 1.);
      Matrix4x4 T = newJoint->getTransformation();
      Matrix4x4 invT = T.inv();
      endPos = (invT * endPos4d).projectTo3D();

      newJoint->axis = endPos;
      double meshScale = mesh->get_bbox().extent.norm();
      newJoint->renderScale = meshScale;
      newJoint->capsuleRadius *= meshScale;
      if (parent != nullptr)
        parent->kids.push_back(newJoint);
      joints.push_back(newJoint);

      return newJoint;
   }